

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<ComponentInfo>::reallocateAndGrow
          (QArrayDataPointer<ComponentInfo> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<ComponentInfo> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  Data *pDVar3;
  undefined8 uVar4;
  qsizetype qVar5;
  ComponentInfo *pCVar6;
  ComponentInfo *pCVar7;
  ComponentInfo *pCVar8;
  long lVar9;
  Int IVar10;
  long lVar11;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<ComponentInfo> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (ComponentInfo *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = this->d;
  if (pDVar2 == (Data *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (pDVar2->super_QArrayData).alloc;
  }
  lVar11 = this->size;
  if (lVar9 < lVar11) {
    lVar9 = lVar11;
  }
  if (where == GrowsAtEnd) {
    if (pDVar2 != (Data *)0x0) {
      lVar11 = (lVar11 - (pDVar2->super_QArrayData).alloc) +
               ((long)((long)this->ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 4) * -0x5555555555555555;
      goto LAB_0012d97b;
    }
  }
  else if (pDVar2 != (Data *)0x0) {
    lVar11 = ((long)((long)this->ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             4) * 0x5555555555555555;
    goto LAB_0012d97b;
  }
  lVar11 = 0;
LAB_0012d97b:
  lVar11 = lVar9 + n + lVar11;
  if (pDVar2 != (Data *)0x0) {
    lVar9 = (pDVar2->super_QArrayData).alloc;
    if (lVar9 <= lVar11) {
      lVar9 = lVar11;
    }
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar11 = lVar9;
    }
  }
  if (pDVar2 == (Data *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (pDVar2->super_QArrayData).alloc;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pCVar6 = (ComponentInfo *)QArrayData::allocate(&local_30,0x30,0x10,lVar11,(uint)(lVar11 <= lVar9))
  ;
  if (pCVar6 != (ComponentInfo *)0x0 && local_30 != (QArrayData *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar11 = (local_30->alloc - (this->size + n)) / 2;
      lVar9 = 0;
      if (0 < lVar11) {
        lVar9 = lVar11;
      }
      lVar9 = lVar9 + n;
    }
    else if (this->d == (Data *)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = ((long)((long)this->ptr -
                     ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
              >> 4) * -0x5555555555555555;
    }
    if (this->d == (Data *)0x0) {
      IVar10 = 0;
    }
    else {
      IVar10 = (this->d->super_QArrayData).flags.
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pCVar6 = pCVar6 + lVar9;
    (local_30->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar10;
  }
  local_48.size = 0;
  lVar9 = this->size;
  if (lVar9 != 0) {
    if ((this->d == (Data *)0x0) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      if (0 < lVar9) {
        pCVar7 = this->ptr;
        pCVar8 = pCVar7 + lVar9;
        do {
          pDVar3 = (pCVar7->name).d.d;
          pCVar6[local_48.size].name.d.d = pDVar3;
          pCVar6[local_48.size].name.d.ptr = (pCVar7->name).d.ptr;
          pCVar6[local_48.size].name.d.size = (pCVar7->name).d.size;
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pDVar3 = (pCVar7->path).d.d;
          pCVar6[local_48.size].path.d.d = pDVar3;
          pCVar6[local_48.size].path.d.ptr = (pCVar7->path).d.ptr;
          pCVar6[local_48.size].path.d.size = (pCVar7->path).d.size;
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pCVar7 = pCVar7 + 1;
          local_48.size = local_48.size + 1;
        } while (pCVar7 < pCVar8);
      }
    }
    else if (0 < lVar9) {
      pCVar7 = this->ptr;
      local_48.size = 0;
      lVar11 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pCVar7->name).d.d + lVar11);
        uVar4 = *puVar1;
        *puVar1 = 0;
        *(undefined8 *)((long)&(pCVar6->name).d.d + lVar11) = uVar4;
        uVar4 = puVar1[1];
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pCVar6->name).d.ptr + lVar11) = uVar4;
        uVar4 = puVar1[2];
        puVar1[2] = 0;
        *(undefined8 *)((long)&(pCVar6->name).d.size + lVar11) = uVar4;
        uVar4 = puVar1[3];
        puVar1[3] = 0;
        *(undefined8 *)((long)&(pCVar6->path).d.d + lVar11) = uVar4;
        uVar4 = puVar1[4];
        puVar1[4] = 0;
        *(undefined8 *)((long)&(pCVar6->path).d.ptr + lVar11) = uVar4;
        uVar4 = puVar1[5];
        puVar1[5] = 0;
        *(undefined8 *)((long)&(pCVar6->path).d.size + lVar11) = uVar4;
        local_48.size = local_48.size + 1;
        lVar11 = lVar11 + 0x30;
      } while ((ComponentInfo *)(puVar1 + 6) < pCVar7 + lVar9);
    }
  }
  local_48.d = this->d;
  local_48.ptr = this->ptr;
  this->d = (Data *)local_30;
  this->ptr = pCVar6;
  qVar5 = this->size;
  this->size = local_48.size;
  local_48.size = qVar5;
  ~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }